

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONDebug.cpp
# Opt level: O1

void JSONDebug::_JSON_FAIL(json_string *msg)

{
  if (JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_ ==
      '\0') {
    _JSON_FAIL();
  }
  if (JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_ !=
      (code *)0x0) {
    (*JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_)
              (msg);
  }
  return;
}

Assistant:

void JSONDebug::_JSON_FAIL(const json_string & msg) json_nothrow {
    #ifdef JSON_STDERROR  //no callback, just use stderror
	   #ifndef JSON_UNICODE
		  std::cerr << msg << std::endl;
	   #else
		  std::cerr << std::string(msg.begin(), msg.end()) << std::endl;
	   #endif
    #else
	   if (json_error_callback_t ErrorCallback = JSONSingleton<json_error_callback_t>::get()){  //only do anything if the callback is registered
		  #ifdef JSON_LIBRARY
			 ErrorCallback(msg.c_str());
		  #else
			 ErrorCallback(msg);
		  #endif
	   }
    #endif
}